

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

TermList ApplicativeHelper::createAppTerm
                   (TermList sort,TermList head,TermList *args,uint arity,bool shared)

{
  TermList arg2;
  TermList s1_00;
  TermList TVar1;
  TermList arg1;
  uint in_ECX;
  long in_RDX;
  uint64_t in_RSI;
  undefined1 in_R8B;
  uint i;
  TermList s2;
  TermList s1;
  TermList res;
  TermList in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar2;
  TermList s2_00;
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar3;
  uint64_t local_8;
  
  uVar3 = CONCAT13(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffff;
  Kernel::TermList::TermList((TermList *)&stack0xffffffffffffffd0);
  Kernel::TermList::TermList((TermList *)&stack0xffffffffffffffc8);
  local_8 = in_RSI;
  for (uVar2 = 0; uVar2 < in_ECX; uVar2 = uVar2 + 1) {
    TVar1 = getNthArg(in_stack_ffffffffffffff78,0);
    s2_00 = TVar1;
    arg1 = getResultApplieadToNArgs(in_stack_ffffffffffffff78,0);
    in_stack_ffffffffffffff78._content = *(uint64_t *)(in_RDX + (ulong)uVar2 * 8);
    s1_00._content._4_4_ = in_ECX;
    s1_00._content._0_4_ = uVar3;
    arg2._content._4_4_ = uVar2;
    arg2._content._0_4_ = in_stack_ffffffffffffffc0;
    local_8 = (uint64_t)createAppTerm(s1_00,s2_00,arg1,arg2,SUB81(TVar1._content >> 0x38,0));
  }
  return (TermList)local_8;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList sort, TermList head, TermList* args, unsigned arity, bool shared)
{
  ASS_REP(head.isVar() || SortHelper::getResultSort(head.term()) == sort, sort.toString() );

  TermList res = head;
  TermList s1, s2;

  for(unsigned i = 0; i < arity; i++){
    s1 = getNthArg(sort, 1);
    s2 = getResultApplieadToNArgs(sort, 1);
    res = createAppTerm(s1, s2, res, args[i], shared);
    sort = s2;
  }
  return res; 
}